

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetBX2Transform(ndicapi *pol,int portHandle,float *transform)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float *pfVar5;
  ulong uVar6;
  
  uVar1 = pol->Bx2HandleCount;
  uVar6 = 0;
  if ((long)(int)uVar1 < 1) {
LAB_0010a55f:
    if ((uint)uVar6 != uVar1) {
      uVar6 = uVar6 & 0xffffffff;
      uVar2 = *(undefined8 *)pol->Bx2Transforms[uVar6];
      uVar3 = *(undefined8 *)(pol->Bx2Transforms[uVar6] + 2);
      pfVar5 = pol->Bx2Transforms[uVar6];
      uVar4 = *(undefined8 *)(pfVar5 + 6);
      *(undefined8 *)(transform + 4) = *(undefined8 *)(pfVar5 + 4);
      *(undefined8 *)(transform + 6) = uVar4;
      *(undefined8 *)transform = uVar2;
      *(undefined8 *)(transform + 2) = uVar3;
      if ((pol->Bx2HandlesStatus[uVar6] & 4) == 0) {
        return pol->Bx2HandlesStatus[uVar6] >> 7 & 2;
      }
    }
  }
  else {
    do {
      if ((uint)pol->Bx2Handles[uVar6] == portHandle) goto LAB_0010a55f;
      uVar6 = uVar6 + 1;
    } while ((long)(int)uVar1 != uVar6);
  }
  return 1;
}

Assistant:

ndicapiExport int ndiGetBX2Transform(ndicapi* pol, int portHandle, float transform[8])
{
  int i, n;

  n = pol->Bx2HandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->Bx2Handles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  memcpy(&transform[0], &pol->Bx2Transforms[i][0], sizeof(float) * 8);
  if (pol->Bx2HandlesStatus[i] & NDI_HANDLE_DISABLED)
  {
    return NDI_DISABLED;
  }
  else if (pol->Bx2HandlesStatus[i] & NDI_BX2_MISSING_BIT)
  {
    return NDI_MISSING;
  }

  return NDI_OKAY;
}